

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void updateFromSelect(Parse *pParse,int iEph,Index *pPk,ExprList *pChanges,SrcList *pTabList,
                     Expr *pWhere,ExprList *pOrderBy,Expr *pLimit)

{
  undefined1 *puVar1;
  u32 *puVar2;
  byte *pbVar3;
  sqlite3 *db;
  Table *pTVar4;
  SrcList *pSrc;
  Expr *pWhere_00;
  Expr *pEVar5;
  ExprList *pList;
  Select *p;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  int iCol;
  ExprList_item *pEVar9;
  SelectDest local_58;
  
  db = pParse->db;
  pTVar4 = pTabList->a[0].pTab;
  pSrc = sqlite3SrcListDup(db,pTabList,0);
  pWhere_00 = sqlite3ExprDup(db,pWhere,0);
  if (pSrc != (SrcList *)0x0) {
    puVar1 = &pSrc->a[0].fg.field_0x2;
    *puVar1 = *puVar1 | 2;
    pSrc->a[0].iCursor = -1;
    puVar2 = &(pSrc->a[0].pTab)->nTabRef;
    *puVar2 = *puVar2 - 1;
    pSrc->a[0].pTab = (Table *)0x0;
  }
  if (pPk == (Index *)0x0) {
    if (pTVar4->eTabType == '\x02') {
      pList = (ExprList *)0x0;
      for (iCol = 0; iCol < pTVar4->nCol; iCol = iCol + 1) {
        pEVar5 = exprRowColumn(pParse,iCol);
        pList = sqlite3ExprListAppend(pParse,pList,pEVar5);
      }
      bVar6 = 0xe;
    }
    else {
      bVar6 = pTVar4->eTabType == '\x01' ^ 0xf;
      pEVar5 = sqlite3PExpr(pParse,0x4b,(Expr *)0x0,(Expr *)0x0);
      pList = sqlite3ExprListAppendNew(pParse->db,pEVar5);
    }
  }
  else {
    pList = (ExprList *)0x0;
    for (uVar7 = 0; uVar7 < pPk->nKeyCol; uVar7 = uVar7 + 1) {
      pEVar5 = exprRowColumn(pParse,(int)pPk->aiColumn[uVar7]);
      pList = sqlite3ExprListAppend(pParse,pList,pEVar5);
    }
    bVar6 = pTVar4->eTabType == '\x01' ^ 0xf;
  }
  if (pChanges != (ExprList *)0x0) {
    pEVar9 = pChanges->a;
    for (lVar8 = 0; lVar8 < pChanges->nExpr; lVar8 = lVar8 + 1) {
      pEVar5 = sqlite3ExprDup(db,pEVar9->pExpr,0);
      pList = sqlite3ExprListAppend(pParse,pList,pEVar5);
      pEVar9 = pEVar9 + 1;
    }
  }
  p = sqlite3SelectNew(pParse,pList,pSrc,pWhere_00,(ExprList *)0x0,(Expr *)0x0,(ExprList *)0x0,
                       0x820000,(Expr *)0x0);
  if (p != (Select *)0x0) {
    pbVar3 = (byte *)((long)&p->selFlags + 3);
    *pbVar3 = *pbVar3 | 8;
  }
  local_58.zAffSdst = (char *)0x0;
  local_58.iSdst = 0;
  local_58.nSdst = 0;
  if (pPk == (Index *)0x0) {
    local_58.iSDParm2 = 0xffffffff;
  }
  else {
    local_58.iSDParm2 = (int)pPk->nKeyCol;
  }
  local_58.eDest = bVar6;
  local_58.iSDParm = iEph;
  sqlite3Select(pParse,p,&local_58);
  sqlite3SelectDelete(db,p);
  return;
}

Assistant:

static void updateFromSelect(
  Parse *pParse,                  /* Parse context */
  int iEph,                       /* Cursor for open eph. table */
  Index *pPk,                     /* PK if table 0 is WITHOUT ROWID */
  ExprList *pChanges,             /* List of expressions to return */
  SrcList *pTabList,              /* List of tables to select from */
  Expr *pWhere,                   /* WHERE clause for query */
  ExprList *pOrderBy,             /* ORDER BY clause */
  Expr *pLimit                    /* LIMIT clause */
){
  int i;
  SelectDest dest;
  Select *pSelect = 0;
  ExprList *pList = 0;
  ExprList *pGrp = 0;
  Expr *pLimit2 = 0;
  ExprList *pOrderBy2 = 0;
  sqlite3 *db = pParse->db;
  Table *pTab = pTabList->a[0].pTab;
  SrcList *pSrc;
  Expr *pWhere2;
  int eDest;

#ifdef SQLITE_ENABLE_UPDATE_DELETE_LIMIT
  if( pOrderBy && pLimit==0 ) {
    sqlite3ErrorMsg(pParse, "ORDER BY without LIMIT on UPDATE");
    return;
  }
  pOrderBy2 = sqlite3ExprListDup(db, pOrderBy, 0);
  pLimit2 = sqlite3ExprDup(db, pLimit, 0);
#else
  UNUSED_PARAMETER(pOrderBy);
  UNUSED_PARAMETER(pLimit);
#endif

  pSrc = sqlite3SrcListDup(db, pTabList, 0);
  pWhere2 = sqlite3ExprDup(db, pWhere, 0);

  assert( pTabList->nSrc>1 );
  if( pSrc ){
    pSrc->a[0].fg.notCte = 1;
    pSrc->a[0].iCursor = -1;
    pSrc->a[0].pTab->nTabRef--;
    pSrc->a[0].pTab = 0;
  }
  if( pPk ){
    for(i=0; i<pPk->nKeyCol; i++){
      Expr *pNew = exprRowColumn(pParse, pPk->aiColumn[i]);
#ifdef SQLITE_ENABLE_UPDATE_DELETE_LIMIT
      if( pLimit ){
        pGrp = sqlite3ExprListAppend(pParse, pGrp, sqlite3ExprDup(db, pNew, 0));
      }
#endif
      pList = sqlite3ExprListAppend(pParse, pList, pNew);
    }
    eDest = IsVirtual(pTab) ? SRT_Table : SRT_Upfrom;
  }else if( IsView(pTab) ){
    for(i=0; i<pTab->nCol; i++){
      pList = sqlite3ExprListAppend(pParse, pList, exprRowColumn(pParse, i));
    }
    eDest = SRT_Table;
  }else{
    eDest = IsVirtual(pTab) ? SRT_Table : SRT_Upfrom;
    pList = sqlite3ExprListAppend(pParse, 0, sqlite3PExpr(pParse,TK_ROW,0,0));
#ifdef SQLITE_ENABLE_UPDATE_DELETE_LIMIT
    if( pLimit ){
      pGrp = sqlite3ExprListAppend(pParse, 0, sqlite3PExpr(pParse,TK_ROW,0,0));
    }
#endif
  }
  assert( pChanges!=0 || pParse->db->mallocFailed );
  if( pChanges ){
    for(i=0; i<pChanges->nExpr; i++){
      pList = sqlite3ExprListAppend(pParse, pList,
          sqlite3ExprDup(db, pChanges->a[i].pExpr, 0)
      );
    }
  }
  pSelect = sqlite3SelectNew(pParse, pList,
      pSrc, pWhere2, pGrp, 0, pOrderBy2, SF_UFSrcCheck|SF_IncludeHidden, pLimit2
  );
  if( pSelect ) pSelect->selFlags |= SF_OrderByReqd;
  sqlite3SelectDestInit(&dest, eDest, iEph);
  dest.iSDParm2 = (pPk ? pPk->nKeyCol : -1);
  sqlite3Select(pParse, pSelect, &dest);
  sqlite3SelectDelete(db, pSelect);
}